

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.h
# Opt level: O1

void __thiscall FIX::FileLogFactory::~FileLogFactory(FileLogFactory *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__FileLogFactory_001f8b18;
  Dictionary::~Dictionary(&(this->m_settings).m_defaults);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
               *)&this->m_settings);
  pcVar2 = (this->m_backupPath)._M_dataplus._M_p;
  paVar1 = &(this->m_backupPath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_path)._M_dataplus._M_p;
  paVar1 = &(this->m_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xe8);
  return;
}

Assistant:

FileLogFactory(const SessionSettings &settings)
      : m_settings(settings),
        m_globalLog(0),
        m_globalLogCount(0) {}